

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O0

void __thiscall ManchesterAnalyzer::~ManchesterAnalyzer(ManchesterAnalyzer *this)

{
  ManchesterAnalyzer *this_local;
  
  ~ManchesterAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

ManchesterAnalyzer::~ManchesterAnalyzer()
{
    KillThread();
}